

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool cmGetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong uVar6;
  cmMakefile *pcVar7;
  cmState *pcVar8;
  cmPropertyDefinition *pcVar9;
  string *psVar10;
  reference ppcVar11;
  string_view sVar12;
  byte local_3c9;
  bool source_file_paths_should_be_absolute;
  cmMakefile *directory_scope_mf;
  string_view local_2b8;
  string_view local_2a8;
  cmPropertyDefinition *local_298;
  cmPropertyDefinition *def_1;
  string output_1;
  cmPropertyDefinition *def;
  string output;
  undefined1 local_230 [7];
  bool file_scopes_handled;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  string local_210;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1c0;
  string local_190;
  uint local_16c;
  int local_168;
  uint i;
  Doing doing;
  cmAlphaNum local_130;
  string local_100;
  ScopeType local_e0;
  byte local_da;
  byte local_d9;
  ScopeType scope;
  bool source_file_target_option_enabled;
  bool source_file_directory_option_enabled;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  string propertyName;
  string name;
  string *variable;
  allocator<char> local_49;
  string local_48;
  OutType local_24;
  cmExecutionStatus *pcStack_20;
  OutType infoType;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_24 = OutValue;
  pcStack_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = pcStack_20;
  if (sVar3 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmExecutionStatus::SetError(pcVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    args_local._7_1_ = 0;
    goto LAB_00607332;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  std::__cxx11::string::string((string *)(propertyName.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &source_file_directories.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&source_file_target_directories.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&scope);
  local_d9 = 0;
  local_da = 0;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,1);
  bVar2 = std::operator==(pvVar5,"GLOBAL");
  if (bVar2) {
    local_e0 = GLOBAL;
LAB_0060670d:
    local_168 = 1;
    for (local_16c = 2; uVar6 = (ulong)local_16c,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local), uVar6 < sVar3; local_16c = local_16c + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(ulong)local_16c);
      bVar2 = std::operator==(pvVar5,"PROPERTY");
      if (bVar2) {
        local_168 = 2;
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_16c);
        bVar2 = std::operator==(pvVar5,"BRIEF_DOCS");
        if (bVar2) {
          local_168 = 0;
          local_24 = OutBriefDoc;
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_16c);
          bVar2 = std::operator==(pvVar5,"FULL_DOCS");
          if (bVar2) {
            local_168 = 0;
            local_24 = OutFullDoc;
          }
          else {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(ulong)local_16c);
            bVar2 = std::operator==(pvVar5,"SET");
            if (bVar2) {
              local_168 = 0;
              local_24 = OutSet;
            }
            else {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(ulong)local_16c);
              bVar2 = std::operator==(pvVar5,"DEFINED");
              if (bVar2) {
                local_168 = 0;
                local_24 = OutDefined;
              }
              else if (local_168 == 1) {
                local_168 = 0;
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)status_local,(ulong)local_16c);
                std::__cxx11::string::operator=
                          ((string *)(propertyName.field_2._M_local_buf + 8),(string *)pvVar5);
              }
              else {
                if ((local_168 == 0) && (local_e0 == SOURCE_FILE)) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_16c);
                  bVar2 = std::operator==(pvVar5,"DIRECTORY");
                  if (bVar2) {
                    local_168 = 4;
                    local_d9 = 1;
                    goto LAB_00606b1c;
                  }
                }
                if ((local_168 == 0) && (local_e0 == SOURCE_FILE)) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_16c);
                  bVar2 = std::operator==(pvVar5,"TARGET_DIRECTORY");
                  if (bVar2) {
                    local_168 = 5;
                    local_da = 1;
                    goto LAB_00606b1c;
                  }
                }
                pcVar1 = pcStack_20;
                if (local_168 == 4) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_16c);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&source_file_target_directories.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar5);
                  local_168 = 0;
                }
                else if (local_168 == 5) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_16c);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&scope,pvVar5);
                  local_168 = 0;
                }
                else {
                  if (local_168 != 2) {
                    cmAlphaNum::cmAlphaNum(&local_1c0,"given invalid argument \"");
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)status_local,(ulong)local_16c);
                    cmAlphaNum::cmAlphaNum(&local_1f0,pvVar4);
                    cmStrCat<char[3]>(&local_190,&local_1c0,&local_1f0,(char (*) [3])0xd2b755);
                    cmExecutionStatus::SetError(pcVar1,&local_190);
                    std::__cxx11::string::~string((string *)&local_190);
                    args_local._7_1_ = 0;
                    i = 1;
                    goto LAB_006072d4;
                  }
                  local_168 = 0;
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_16c);
                  std::__cxx11::string::operator=
                            ((string *)
                             &source_file_directories.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar5);
                }
              }
            }
          }
        }
      }
LAB_00606b1c:
    }
    uVar6 = std::__cxx11::string::empty();
    pcVar1 = pcStack_20;
    if ((uVar6 & 1) == 0) {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
                ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_230);
      output.field_2._M_local_buf[0xf] =
           SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                     (pcStack_20,(bool)(local_d9 & 1),(bool)(local_da & 1),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&source_file_target_directories.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&scope,(vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_230);
      if (!(bool)output.field_2._M_local_buf[0xf]) {
        args_local._7_1_ = false;
        goto LAB_006072b8;
      }
      if (local_24 == OutBriefDoc) {
        std::__cxx11::string::string((string *)&def);
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        pcVar8 = cmMakefile::GetState(pcVar7);
        pcVar9 = cmState::GetPropertyDefinition
                           (pcVar8,(string *)
                                   &source_file_directories.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_e0);
        if (pcVar9 != (cmPropertyDefinition *)0x0) {
          psVar10 = cmPropertyDefinition::GetShortDescription_abi_cxx11_(pcVar9);
          std::__cxx11::string::operator=((string *)&def,(string *)psVar10);
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) != 0) {
          std::__cxx11::string::operator=((string *)&def,"NOTFOUND");
        }
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        sVar12 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&def);
        output_1.field_2._8_8_ = sVar12._M_len;
        cmMakefile::AddDefinition(pcVar7,pvVar4,sVar12);
        std::__cxx11::string::~string((string *)&def);
        goto switchD_006070a8_default;
      }
      if (local_24 == OutFullDoc) {
        std::__cxx11::string::string((string *)&def_1);
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        pcVar8 = cmMakefile::GetState(pcVar7);
        local_298 = cmState::GetPropertyDefinition
                              (pcVar8,(string *)
                                      &source_file_directories.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_e0);
        if (local_298 != (cmPropertyDefinition *)0x0) {
          psVar10 = cmPropertyDefinition::GetFullDescription_abi_cxx11_(local_298);
          std::__cxx11::string::operator=((string *)&def_1,(string *)psVar10);
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) != 0) {
          std::__cxx11::string::operator=((string *)&def_1,"NOTFOUND");
        }
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        local_2a8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&def_1);
        cmMakefile::AddDefinition(pcVar7,pvVar4,local_2a8);
        std::__cxx11::string::~string((string *)&def_1);
        goto switchD_006070a8_default;
      }
      if (local_24 == OutDefined) {
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        pcVar8 = cmMakefile::GetState(pcVar7);
        pcVar9 = cmState::GetPropertyDefinition
                           (pcVar8,(string *)
                                   &source_file_directories.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_e0);
        if (pcVar9 == (cmPropertyDefinition *)0x0) {
          pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&directory_scope_mf,"0");
          cmMakefile::AddDefinition(pcVar7,pvVar4,_directory_scope_mf);
        }
        else {
          pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b8,"1");
          cmMakefile::AddDefinition(pcVar7,pvVar4,local_2b8);
        }
        goto switchD_006070a8_default;
      }
      ppcVar11 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                           ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_230,0);
      sVar12._M_str = local_2a8._M_str;
      sVar12._M_len = local_2a8._M_len;
      local_3c9 = 1;
      if ((local_d9 & 1) == 0) {
        local_3c9 = local_da;
      }
      switch(local_e0) {
      case TARGET:
        args_local._7_1_ =
             anon_unknown.dwarf_b53b8e::HandleTargetMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case SOURCE_FILE:
        args_local._7_1_ =
             anon_unknown.dwarf_b53b8e::HandleSourceMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppcVar11,
                        (bool)(local_3c9 & 1));
        break;
      case DIRECTORY:
        args_local._7_1_ =
             anon_unknown.dwarf_b53b8e::HandleDirectoryMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case GLOBAL:
        args_local._7_1_ =
             anon_unknown.dwarf_b53b8e::HandleGlobalMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case CACHE:
        args_local._7_1_ =
             anon_unknown.dwarf_b53b8e::HandleCacheMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case TEST:
        args_local._7_1_ =
             anon_unknown.dwarf_b53b8e::HandleTestMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case VARIABLE:
        args_local._7_1_ =
             anon_unknown.dwarf_b53b8e::HandleVariableMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case CACHED_VARIABLE:
        local_2a8 = sVar12;
      default:
switchD_006070a8_default:
        args_local._7_1_ = true;
        break;
      case INSTALL:
        args_local._7_1_ =
             anon_unknown.dwarf_b53b8e::HandleInstallMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
LAB_006072b8:
      i = 1;
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
                ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_230);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"not given a PROPERTY <name> argument.",
                 (allocator<char> *)
                 ((long)&source_file_directory_makefiles.
                         super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      cmExecutionStatus::SetError(pcVar1,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&source_file_directory_makefiles.
                         super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      args_local._7_1_ = 0;
      i = 1;
    }
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"DIRECTORY");
    if (bVar2) {
      local_e0 = DIRECTORY;
      goto LAB_0060670d;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"TARGET");
    if (bVar2) {
      local_e0 = TARGET;
      goto LAB_0060670d;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"SOURCE");
    if (bVar2) {
      local_e0 = SOURCE_FILE;
      goto LAB_0060670d;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"TEST");
    if (bVar2) {
      local_e0 = TEST;
      goto LAB_0060670d;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"VARIABLE");
    if (bVar2) {
      local_e0 = VARIABLE;
      goto LAB_0060670d;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"CACHE");
    if (bVar2) {
      local_e0 = CACHE;
      goto LAB_0060670d;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"INSTALL");
    pcVar1 = pcStack_20;
    if (bVar2) {
      local_e0 = INSTALL;
      goto LAB_0060670d;
    }
    cmAlphaNum::cmAlphaNum(&local_130,"given invalid scope ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&doing,pvVar4);
    cmStrCat<char[87]>(&local_100,&local_130,(cmAlphaNum *)&doing,
                       (char (*) [87])
                       ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."
                      );
    cmExecutionStatus::SetError(pcVar1,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    args_local._7_1_ = 0;
    i = 1;
  }
LAB_006072d4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&scope);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&source_file_target_directories.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &source_file_directories.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(propertyName.field_2._M_local_buf + 8));
LAB_00607332:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  OutType infoType = OutValue;
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  std::string name;
  std::string propertyName;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if (args[1] == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (args[1] == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (args[1] == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (args[1] == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (args[1] == "TEST") {
    scope = cmProperty::TEST;
  } else if (args[1] == "VARIABLE") {
    scope = cmProperty::VARIABLE;
  } else if (args[1] == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (args[1] == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat(
      "given invalid scope ", args[1],
      ".  "
      "Valid scopes are "
      "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."));
    return false;
  }

  // Parse remaining arguments.
  enum Doing
  {
    DoingNone,
    DoingName,
    DoingProperty,
    DoingType,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingName;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "PROPERTY") {
      doing = DoingProperty;
    } else if (args[i] == "BRIEF_DOCS") {
      doing = DoingNone;
      infoType = OutBriefDoc;
    } else if (args[i] == "FULL_DOCS") {
      doing = DoingNone;
      infoType = OutFullDoc;
    } else if (args[i] == "SET") {
      doing = DoingNone;
      infoType = OutSet;
    } else if (args[i] == "DEFINED") {
      doing = DoingNone;
      infoType = OutDefined;
    } else if (doing == DoingName) {
      doing = DoingNone;
      name = args[i];
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingProperty) {
      doing = DoingNone;
      propertyName = args[i];
    } else {
      status.SetError(cmStrCat("given invalid argument \"", args[i], "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  // Compute requested output.
  if (infoType == OutBriefDoc) {
    // Lookup brief documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetShortDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutFullDoc) {
    // Lookup full documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetFullDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutDefined) {
    // Lookup if the property is defined
    if (status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                               scope)) {
      status.GetMakefile().AddDefinition(variable, "1");
    } else {
      status.GetMakefile().AddDefinition(variable, "0");
    }
  } else {
    // Dispatch property getting.
    cmMakefile& directory_scope_mf = *(source_file_directory_makefiles[0]);
    bool source_file_paths_should_be_absolute =
      source_file_directory_option_enabled ||
      source_file_target_option_enabled;

    switch (scope) {
      case cmProperty::GLOBAL:
        return HandleGlobalMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::DIRECTORY:
        return HandleDirectoryMode(status, name, infoType, variable,
                                   propertyName);
      case cmProperty::TARGET:
        return HandleTargetMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::SOURCE_FILE:
        return HandleSourceMode(status, name, infoType, variable, propertyName,
                                directory_scope_mf,
                                source_file_paths_should_be_absolute);
      case cmProperty::TEST:
        return HandleTestMode(status, name, infoType, variable, propertyName);
      case cmProperty::VARIABLE:
        return HandleVariableMode(status, name, infoType, variable,
                                  propertyName);
      case cmProperty::CACHE:
        return HandleCacheMode(status, name, infoType, variable, propertyName);
      case cmProperty::INSTALL:
        return HandleInstallMode(status, name, infoType, variable,
                                 propertyName);

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
    }
  }

  return true;
}